

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_psx_File.cpp
# Opt level: O3

uint64_t __thiscall axl::io::psx::File::getSize(File *this)

{
  int iVar1;
  stat64 stat;
  stat64 local_90;
  
  iVar1 = fstat64((this->super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>).m_h,
                  &local_90);
  if (iVar1 == -1) {
    err::setLastSystemError();
    local_90.st_size = 0xffffffffffffffff;
  }
  return local_90.st_size;
}

Assistant:

uint64_t
File::getSize() const {
#if (_AXL_OS_DARWIN)
	struct stat stat;
	int result = ::fstat(m_h, &stat);
#else
	struct stat64 stat;
	int result = ::fstat64(m_h, &stat);
#endif

	if (result == -1)
		return err::failWithLastSystemError<uint64_t>(-1);

	return stat.st_size;
}